

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result wabt::ReadBinaryObjdump
                 (uint8_t *data,size_t size,ObjdumpOptions *options,ObjdumpState *state)

{
  Result RVar1;
  pointer *__ptr;
  ReadBinaryOptions read_options;
  Features features;
  BinaryReaderObjdumpPrepass reader;
  ReadBinaryOptions local_1a0;
  Features local_17c;
  BinaryReaderDelegate local_170;
  ObjdumpOptions *local_160;
  ObjdumpState *local_158;
  uint8_t *local_150;
  size_t local_148;
  undefined1 local_140;
  undefined4 local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  void *local_c8;
  undefined1 uStack_c0;
  undefined7 uStack_bf;
  undefined1 uStack_b8;
  undefined8 uStack_b7;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  long *local_88;
  undefined6 local_80;
  undefined2 uStack_7a;
  undefined4 uStack_78;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined4 uStack_70;
  undefined8 uStack_6c;
  undefined2 local_40;
  undefined8 local_3c;
  undefined4 local_34;
  
  local_17c.exceptions_enabled_ = false;
  local_17c.mutable_globals_enabled_ = true;
  local_17c.sat_float_to_int_enabled_ = false;
  local_17c.sign_extension_enabled_ = false;
  local_17c.simd_enabled_ = false;
  local_17c.threads_enabled_ = false;
  local_17c.multi_value_enabled_ = false;
  local_17c.tail_call_enabled_ = false;
  local_17c.bulk_memory_enabled_ = false;
  local_17c.reference_types_enabled_ = false;
  local_17c.annotations_enabled_ = false;
  local_17c.gc_enabled_ = false;
  Features::EnableAll(&local_17c);
  local_1a0.log_stream = options->log_stream;
  local_1a0.features.annotations_enabled_ = local_17c.annotations_enabled_;
  local_1a0.features.gc_enabled_ = local_17c.gc_enabled_;
  local_1a0.features.bulk_memory_enabled_ = local_17c.bulk_memory_enabled_;
  local_1a0.features.reference_types_enabled_ = local_17c.reference_types_enabled_;
  local_1a0.features.sat_float_to_int_enabled_ = local_17c.sat_float_to_int_enabled_;
  local_1a0.features.sign_extension_enabled_ = local_17c.sign_extension_enabled_;
  local_1a0.features.simd_enabled_ = local_17c.simd_enabled_;
  local_1a0.features.threads_enabled_ = local_17c.threads_enabled_;
  local_1a0.features.multi_value_enabled_ = local_17c.multi_value_enabled_;
  local_1a0.features.tail_call_enabled_ = local_17c.tail_call_enabled_;
  local_1a0.features.exceptions_enabled_ = local_17c.exceptions_enabled_;
  local_1a0.features.mutable_globals_enabled_ = local_17c.mutable_globals_enabled_;
  local_1a0.read_debug_names = true;
  local_1a0.stop_on_first_error = false;
  local_1a0.fail_on_custom_section_error = false;
  local_160 = options;
  local_158 = state;
  local_150 = data;
  local_148 = size;
  if (options->mode == Disassemble) {
    local_170._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_00150150;
    local_88 = (long *)((ulong)local_88 & 0xffffffff00000000);
    local_80 = 0;
    uStack_7a = 0;
    uStack_78 = 0;
    uStack_74 = 0;
    uStack_72 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
  }
  else {
    if (options->mode != Prepass) {
      local_a8 = local_98;
      local_170.state = (State *)0x0;
      local_140 = 0;
      local_13c = 0xffffffff;
      local_c8 = (void *)0x0;
      uStack_c0 = 0;
      uStack_bf = 0;
      uStack_b8 = 0;
      uStack_b7 = 0;
      local_a0 = 0;
      local_98[0] = 0;
      local_138 = 0;
      uStack_130 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_170._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdump_001507d8;
      FileStream::CreateStdout();
      local_40 = 0;
      local_3c = 0;
      local_34 = 0;
      local_80 = 0;
      uStack_7a = 0;
      uStack_78 = 0;
      uStack_74 = 0;
      RVar1 = ReadBinary(data,size,&local_170,&local_1a0);
      local_170._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdump_001507d8;
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
      }
      local_88 = (long *)0x0;
      goto LAB_0012669e;
    }
    local_170._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_0014f440;
  }
  local_a8 = local_98;
  local_98[0] = 0;
  local_a0 = 0;
  uStack_b7 = 0;
  uStack_b8 = 0;
  uStack_bf = 0;
  uStack_c0 = 0;
  local_c8 = (void *)0x0;
  uStack_d0 = 0;
  local_d8 = 0;
  uStack_e0 = 0;
  local_e8 = 0;
  uStack_f0 = 0;
  local_f8 = 0;
  uStack_100 = 0;
  local_108 = 0;
  uStack_110 = 0;
  local_118 = 0;
  uStack_120 = 0;
  local_128 = 0;
  uStack_130 = 0;
  local_138 = 0;
  local_13c = 0xffffffff;
  local_140 = 0;
  local_170.state = (State *)0x0;
  RVar1 = ReadBinary(data,size,&local_170,&local_1a0);
LAB_0012669e:
  local_170._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_0014fae0;
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryObjdump(const uint8_t* data,
                         size_t size,
                         ObjdumpOptions* options,
                         ObjdumpState* state) {
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = false;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions read_options(features, options->log_stream, kReadDebugNames,
                                 kStopOnFirstError, kFailOnCustomSectionError);

  switch (options->mode) {
    case ObjdumpMode::Prepass: {
      BinaryReaderObjdumpPrepass reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    case ObjdumpMode::Disassemble: {
      BinaryReaderObjdumpDisassemble reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    default: {
      BinaryReaderObjdump reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
  }
}